

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  ImWchar IVar7;
  undefined2 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  ImFontGlyph *pIVar13;
  ImFontGlyph *pIVar14;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  
  uVar17 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar17 == 0) {
    uVar18 = 1;
  }
  else {
    lVar16 = 0;
    uVar18 = 0;
    do {
      uVar1 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar16);
      uVar12 = (uint)uVar1;
      if (uVar1 < uVar18) {
        uVar12 = uVar18;
      }
      uVar18 = uVar12;
      lVar16 = lVar16 + 0x28;
    } while (uVar17 * 0x28 != lVar16);
    uVar18 = uVar18 + 1;
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  GrowIndex(this,uVar18);
  iVar20 = (this->Glyphs).Size;
  lVar16 = (long)iVar20;
  if (0 < lVar16) {
    pfVar3 = (this->IndexAdvanceX).Data;
    puVar4 = (this->IndexLookup).Data;
    pfVar15 = &((this->Glyphs).Data)->AdvanceX;
    lVar19 = 0;
    do {
      uVar1 = ((ImFontGlyph *)(pfVar15 + -1))->Codepoint;
      pfVar3[uVar1] = *pfVar15;
      puVar4[uVar1] = (unsigned_short)lVar19;
      lVar19 = lVar19 + 1;
      pfVar15 = pfVar15 + 10;
    } while (lVar16 != lVar19);
  }
  if (((this->IndexLookup).Size < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)
     ) {
    pIVar14 = this->FallbackGlyph;
  }
  else {
    pIVar14 = (ImFontGlyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28))
    ;
  }
  if (pIVar14 != (ImFontGlyph *)0x0) {
    if ((this->Glyphs).Data[lVar16 + -1].Codepoint != 9) {
      iVar21 = iVar20 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= iVar20) {
        if (iVar2 == 0) {
          iVar20 = 8;
        }
        else {
          iVar20 = iVar2 / 2 + iVar2;
        }
        if (iVar20 <= iVar21) {
          iVar20 = iVar21;
        }
        if (iVar2 < iVar20) {
          pIVar13 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar20 * 0x28);
          pIVar14 = (this->Glyphs).Data;
          if (pIVar14 != (ImFontGlyph *)0x0) {
            memcpy(pIVar13,pIVar14,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar13;
          (this->Glyphs).Capacity = iVar20;
        }
      }
      (this->Glyphs).Size = iVar21;
    }
    pIVar14 = (this->Glyphs).Data;
    iVar20 = (this->Glyphs).Size;
    if (((this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)
                ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
    fVar22 = pIVar13->V1;
    pIVar14[(long)iVar20 + -1].U1 = pIVar13->U1;
    pIVar14[(long)iVar20 + -1].V1 = fVar22;
    IVar7 = pIVar13->Codepoint;
    uVar8 = *(undefined2 *)&pIVar13->field_0x2;
    fVar9 = pIVar13->AdvanceX;
    fVar10 = pIVar13->X0;
    fVar11 = pIVar13->Y0;
    fVar22 = pIVar13->Y1;
    fVar5 = pIVar13->U0;
    fVar6 = pIVar13->V0;
    pIVar14[(long)iVar20 + -1].X1 = pIVar13->X1;
    pIVar14[(long)iVar20 + -1].Y1 = fVar22;
    pIVar14[(long)iVar20 + -1].U0 = fVar5;
    pIVar14[(long)iVar20 + -1].V0 = fVar6;
    pIVar13 = pIVar14 + (long)iVar20 + -1;
    pIVar13->Codepoint = IVar7;
    *(undefined2 *)&pIVar13->field_0x2 = uVar8;
    pIVar13->AdvanceX = fVar9;
    pIVar14[(long)iVar20 + -1].X0 = fVar10;
    pIVar14[(long)iVar20 + -1].Y0 = fVar11;
    pIVar14[(long)iVar20 + -1].Codepoint = 9;
    fVar22 = pIVar14[(long)iVar20 + -1].AdvanceX * 4.0;
    pIVar14[(long)iVar20 + -1].AdvanceX = fVar22;
    (this->IndexAdvanceX).Data[9] = fVar22;
    (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
  }
  if ((int)(uint)this->FallbackChar < (this->IndexLookup).Size) {
    uVar1 = (this->IndexLookup).Data[this->FallbackChar];
    pIVar14 = (ImFontGlyph *)0x0;
    if (uVar1 != 0xffff) {
      pIVar14 = (ImFontGlyph *)
                ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
  }
  else {
    pIVar14 = (ImFontGlyph *)0x0;
  }
  this->FallbackGlyph = pIVar14;
  fVar22 = 0.0;
  if (pIVar14 != (ImFontGlyph *)0x0) {
    fVar22 = pIVar14->AdvanceX;
  }
  this->FallbackAdvanceX = fVar22;
  pfVar3 = (this->IndexAdvanceX).Data;
  uVar17 = 0;
  do {
    pfVar15 = pfVar3 + uVar17;
    if (*pfVar15 <= 0.0 && *pfVar15 != 0.0) {
      pfVar3[uVar17] = this->FallbackAdvanceX;
    }
    uVar17 = uVar17 + 1;
  } while (uVar18 != uVar17);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= 4;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}